

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint.cpp
# Opt level: O3

Http * __thiscall arbiter::Endpoint::getHttpDriver(Endpoint *this)

{
  Http *pHVar1;
  runtime_error *this_00;
  long *plVar2;
  long *plVar3;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (this->m_driver != (Driver *)0x0) {
    pHVar1 = (Http *)__dynamic_cast(this->m_driver,&Driver::typeinfo,&drivers::Http::typeinfo,0);
    if (pHVar1 != (Http *)0x0) {
      return pHVar1;
    }
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  Driver::profiledProtocol_abi_cxx11_(&local_60,this->m_driver);
  ::std::operator+(&local_40,"Cannot get driver of type ",&local_60);
  plVar2 = (long *)::std::__cxx11::string::append((char *)&local_40);
  local_80 = (long *)*plVar2;
  plVar3 = plVar2 + 2;
  if (local_80 == plVar3) {
    local_70 = *plVar3;
    lStack_68 = plVar2[3];
    local_80 = &local_70;
  }
  else {
    local_70 = *plVar3;
  }
  local_78 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  ::std::runtime_error::runtime_error(this_00,(string *)&local_80);
  *(undefined ***)this_00 = &PTR__runtime_error_001950e8;
  __cxa_throw(this_00,&ArbiterError::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

const drivers::Http& Endpoint::getHttpDriver() const
{
    if (auto d = tryGetHttpDriver()) return *d;
    else throw ArbiterError(
        "Cannot get driver of type " + profiledProtocol() + " as HTTP");
}